

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

size_t readmoredata(char *buffer,size_t size,size_t nitems,void *userp)

{
  long lVar1;
  size_t fullsize;
  HTTP *http;
  connectdata *conn;
  void *userp_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  lVar1 = *(long *)(*userp + 0x1a8);
  buffer_local = (char *)(size * nitems);
  if (*(long *)(lVar1 + 8) == 0) {
    buffer_local = (char *)0x0;
  }
  else {
    *(bool *)(*userp + 0x1a3) = *(int *)(lVar1 + 0x78) == 1;
    if ((long)buffer_local < *(long *)(lVar1 + 8)) {
      memcpy(buffer,*(void **)(lVar1 + 0x10),(size_t)buffer_local);
      *(char **)(lVar1 + 0x10) = buffer_local + *(long *)(lVar1 + 0x10);
      *(long *)(lVar1 + 8) = *(long *)(lVar1 + 8) - (long)buffer_local;
    }
    else {
      memcpy(buffer,*(void **)(lVar1 + 0x10),*(size_t *)(lVar1 + 8));
      buffer_local = *(char **)(lVar1 + 8);
      if (*(long *)(lVar1 + 0x70) == 0) {
        *(undefined8 *)(lVar1 + 8) = 0;
      }
      else {
        *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)(lVar1 + 0x68);
        *(undefined8 *)(lVar1 + 8) = *(undefined8 *)(lVar1 + 0x70);
        *(undefined8 *)(*userp + 600) = *(undefined8 *)(lVar1 + 0x58);
        *(undefined8 *)(*userp + 0x1d8) = *(undefined8 *)(lVar1 + 0x60);
        *(int *)(lVar1 + 0x78) = *(int *)(lVar1 + 0x78) + 1;
        *(undefined8 *)(lVar1 + 0x70) = 0;
      }
    }
  }
  return (size_t)buffer_local;
}

Assistant:

static size_t readmoredata(char *buffer,
                           size_t size,
                           size_t nitems,
                           void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct HTTP *http = conn->data->req.protop;
  size_t fullsize = size * nitems;

  if(0 == http->postsize)
    /* nothing to return */
    return 0;

  /* make sure that a HTTP request is never sent away chunked! */
  conn->data->req.forbidchunk = (http->sending == HTTPSEND_REQUEST)?TRUE:FALSE;

  if(http->postsize <= (curl_off_t)fullsize) {
    memcpy(buffer, http->postdata, (size_t)http->postsize);
    fullsize = (size_t)http->postsize;

    if(http->backup.postsize) {
      /* move backup data into focus and continue on that */
      http->postdata = http->backup.postdata;
      http->postsize = http->backup.postsize;
      conn->data->set.fread_func = http->backup.fread_func;
      conn->data->set.in = http->backup.fread_in;

      http->sending++; /* move one step up */

      http->backup.postsize=0;
    }
    else
      http->postsize = 0;

    return fullsize;
  }

  memcpy(buffer, http->postdata, fullsize);
  http->postdata += fullsize;
  http->postsize -= fullsize;

  return fullsize;
}